

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::bitcast_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BaseType target_type,uint32_t arg)

{
  SPIRType *pSVar1;
  char (*in_R9) [2];
  SPIRType target;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  string local_190;
  undefined1 local_170 [192];
  uint *local_b0;
  size_t local_a8;
  uint local_98 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  to_expression_abi_cxx11_(__return_storage_ptr__,this,arg,true);
  pSVar1 = Compiler::expression_type(&this->super_Compiler,arg);
  if (*(BaseType *)&(pSVar1->super_IVariant).field_0xc != target_type) {
    SPIRType::SPIRType((SPIRType *)local_170,pSVar1);
    local_170._12_4_ = target_type;
    (*(this->super_Compiler)._vptr_Compiler[0x38])(local_1b0,this,local_170,pSVar1);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_190,(spirv_cross *)local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f5ef,
               (char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0]);
    }
    local_170._0_8_ = &PTR__SPIRType_003d8230;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_58);
    local_a8 = 0;
    if (local_b0 != local_98) {
      free(local_b0);
    }
    local_170._144_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_170._136_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_170 + 0xa0)) {
      free((void *)local_170._136_8_);
    }
    local_170._96_8_ = 0;
    if ((undefined1 *)local_170._88_8_ != local_170 + 0x70) {
      free((void *)local_170._88_8_);
    }
    local_170._40_8_ = 0;
    if ((undefined1 *)local_170._32_8_ != local_170 + 0x38) {
      free((void *)local_170._32_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::bitcast_expression(SPIRType::BaseType target_type, uint32_t arg)
{
	auto expr = to_expression(arg);
	auto &src_type = expression_type(arg);
	if (src_type.basetype != target_type)
	{
		auto target = src_type;
		target.basetype = target_type;
		expr = join(bitcast_glsl_op(target, src_type), "(", expr, ")");
	}

	return expr;
}